

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O1

void * __thiscall ON_FixedSizePoolIterator::NextElement(ON_FixedSizePoolIterator *this)

{
  void *pvVar1;
  void *pvVar2;
  ON_FixedSizePool *pOVar3;
  void *pvVar4;
  
  if (this->m_it_element == (void *)0x0) {
    if (this->m_it_block == (void *)0x0) {
      pOVar3 = this->m_fsp;
      if (((pOVar3 == (ON_FixedSizePool *)0x0) ||
          (pvVar1 = pOVar3->m_first_block, pvVar1 == (void *)0x0)) ||
         (pOVar3->m_total_element_count == 0)) {
        this->m_it_block = (void *)0x0;
        this->m_it_element = (void *)0x0;
      }
      else {
        this->m_it_block = pvVar1;
        this->m_it_element = (void *)((long)pvVar1 + 0x10);
      }
    }
    goto LAB_00491821;
  }
  pvVar4 = (void *)((long)this->m_it_element + this->m_fsp->m_sizeof_element);
  this->m_it_element = pvVar4;
  pvVar1 = this->m_fsp->m_al_element_array;
  if (pvVar4 != pvVar1) {
    if (pvVar4 != *(void **)((long)this->m_it_block + 8)) goto LAB_00491821;
    pvVar2 = *this->m_it_block;
    this->m_it_block = pvVar2;
    pvVar4 = (void *)((long)pvVar2 + 0x10);
    if (pvVar2 == (void *)0x0) {
      pvVar4 = (void *)0x0;
    }
    this->m_it_element = pvVar4;
    if (pvVar4 != pvVar1) goto LAB_00491821;
  }
  this->m_it_block = (void *)0x1;
  this->m_it_element = (void *)0x0;
LAB_00491821:
  return this->m_it_element;
}

Assistant:

void* ON_FixedSizePoolIterator::NextElement()
{
  if ( m_it_element )
  {
    m_it_element = (void*)(((char*)m_it_element) + m_fsp->m_sizeof_element);
    if ( m_it_element == m_fsp->m_al_element_array )
    {
      m_it_block = (void*)1; // must be non-zero
      m_it_element = 0; // terminates iteration
    }
    else if ( m_it_element == *((void**)(((char*)m_it_block) + sizeof(void*))) )
    {
      // m_it_element  = "end" pointer which means we are at the end of m_it_block
      m_it_block = *((void**)m_it_block); // m_it_block = "next" block
      m_it_element = (0 != m_it_block)    // m_it_element points to first element in m_it_block
                   ? (void*)(((char*)m_it_block)+2*sizeof(void*))
                   : 0;
      if ( m_it_element == m_fsp->m_al_element_array )
      {
        // terminate iteration (
        m_it_block = (void*)1; // must be non-zero
        m_it_element = 0; // terminates iteration
      }
    }
  }
  else if ( 0 == m_it_block )
  {
    // Start at the beginning.
    FirstElement();
  }
  return m_it_element;
}